

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool Catch::endsWith(string *s,string *suffix)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  undefined1 *local_48;
  size_t local_40;
  undefined1 local_38 [16];
  
  uVar1 = s->_M_string_length;
  uVar2 = suffix->_M_string_length;
  if (uVar2 <= uVar1) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)s);
    if (local_40 == suffix->_M_string_length) {
      if (local_40 == 0) {
        bVar4 = true;
      }
      else {
        iVar3 = bcmp(local_48,(suffix->_M_dataplus)._M_p,local_40);
        bVar4 = iVar3 == 0;
      }
      goto LAB_001304ea;
    }
  }
  bVar4 = false;
LAB_001304ea:
  if ((uVar2 <= uVar1) && (local_48 != local_38)) {
    operator_delete(local_48);
  }
  return bVar4;
}

Assistant:

bool endsWith( std::string const& s, std::string const& suffix ) {
        return s.size() >= suffix.size() && s.substr( s.size()-suffix.size(), suffix.size() ) == suffix;
    }